

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2ThreadTest::CreateImageFromTexture::CreateImageFromTexture
          (CreateImageFromTexture *this,SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *image,
          SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,bool useSync,bool serverSync)

{
  deInt32 *pdVar1;
  Texture *pTVar2;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *pSVar3;
  EGLImage *this_00;
  SharedPtrStateBase *pSVar4;
  SharedPtrStateBase *pSVar5;
  deInt32 *pdVar6;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> local_70;
  SharedPtr<tcu::ThreadUtil::Event> local_60;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_50;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *local_40;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *local_38;
  
  Operation::Operation(&this->super_Operation,"CreateImageFromTexture",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__CreateImageFromTexture_02118db8;
  (this->m_texture).m_ptr = (Texture *)0x0;
  (this->m_texture).m_state = (SharedPtrStateBase *)0x0;
  (this->m_image).m_ptr = (EGLImage *)0x0;
  (this->m_image).m_state = (SharedPtrStateBase *)0x0;
  local_50.m_ptr = &texture->m_ptr->super_Object;
  local_50.m_state = texture->m_state;
  if (local_50.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_50.m_state)->strongRefCount = (local_50.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_50.m_state)->weakRefCount = (local_50.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  local_40 = &this->m_image;
  Operation::modifyGLObject(&this->super_Operation,&local_50);
  pSVar5 = local_50.m_state;
  if (local_50.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_50.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_50.m_ptr = (Object *)0x0;
      (*(local_50.m_state)->_vptr_SharedPtrStateBase[2])(local_50.m_state);
    }
    LOCK();
    pdVar1 = &pSVar5->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_50.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_50.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_50.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  this_00 = (EGLImage *)operator_new(0x68);
  local_60.m_ptr = (this->super_Operation).super_Operation.m_event.m_ptr;
  local_60.m_state = (this->super_Operation).super_Operation.m_event.m_state;
  if (local_60.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_60.m_state)->strongRefCount = (local_60.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_60.m_state)->weakRefCount = (local_60.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  local_70.m_ptr = (this->super_Operation).m_sync.m_ptr;
  local_70.m_state = (this->super_Operation).m_sync.m_state;
  if (local_70.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_70.m_state)->strongRefCount = (local_70.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_70.m_state)->weakRefCount = (local_70.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  EGLImage::EGLImage(this_00,&local_60,&local_70);
  local_38 = texture;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar1 = &pSVar4->strongRefCount;
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021195d8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSVar5 = image->m_state;
  if (pSVar5 != pSVar4) {
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &pSVar5->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        image->m_ptr = (EGLImage *)0x0;
        (*image->m_state->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &image->m_state->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (image->m_state != (SharedPtrStateBase *)0x0) {
          (*image->m_state->_vptr_SharedPtrStateBase[1])();
        }
        image->m_state = (SharedPtrStateBase *)0x0;
      }
    }
    image->m_ptr = this_00;
    image->m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &image->m_state->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pdVar6 = &pSVar4->weakRefCount;
  LOCK();
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar4->_vptr_SharedPtrStateBase[2])(pSVar4);
  }
  pSVar3 = local_38;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    (*pSVar4->_vptr_SharedPtrStateBase[1])(pSVar4);
  }
  pSVar5 = local_70.m_state;
  if (local_70.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_70.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_70.m_ptr = (FenceSync *)0x0;
      (*(local_70.m_state)->_vptr_SharedPtrStateBase[2])(local_70.m_state);
    }
    LOCK();
    pdVar1 = &pSVar5->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_70.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_70.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_70.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pSVar5 = local_60.m_state;
  if (local_60.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_60.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_60.m_ptr = (Event *)0x0;
      (*(local_60.m_state)->_vptr_SharedPtrStateBase[2])(local_60.m_state);
    }
    LOCK();
    pdVar1 = &pSVar5->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_60.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_60.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_60.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pSVar5 = (this->m_image).m_state;
  pSVar4 = image->m_state;
  if (pSVar5 != pSVar4) {
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar5->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_image).m_ptr = (EGLImage *)0x0;
        (*((this->m_image).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_image).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar5 = (this->m_image).m_state;
        if (pSVar5 != (SharedPtrStateBase *)0x0) {
          (*pSVar5->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_image).m_state = (SharedPtrStateBase *)0x0;
      }
      pSVar4 = image->m_state;
    }
    (this->m_image).m_ptr = image->m_ptr;
    (this->m_image).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_image).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  pSVar5 = (this->m_texture).m_state;
  pSVar4 = pSVar3->m_state;
  if (pSVar5 != pSVar4) {
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar5->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_texture).m_ptr = (Texture *)0x0;
        (*((this->m_texture).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_texture).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar5 = (this->m_texture).m_state;
        if (pSVar5 != (SharedPtrStateBase *)0x0) {
          (*pSVar5->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_texture).m_state = (SharedPtrStateBase *)0x0;
      }
      pSVar4 = pSVar3->m_state;
    }
    (this->m_texture).m_ptr = pSVar3->m_ptr;
    (this->m_texture).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_texture).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  pTVar2 = (this->m_texture).m_ptr;
  pSVar5 = (this->m_image).m_state;
  pSVar4 = (pTVar2->sourceImage).m_state;
  if (pSVar4 != pSVar5) {
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar4->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (pTVar2->sourceImage).m_ptr = (EGLImage *)0x0;
        (*((pTVar2->sourceImage).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((pTVar2->sourceImage).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar5 = (pTVar2->sourceImage).m_state;
        if (pSVar5 != (SharedPtrStateBase *)0x0) {
          (*pSVar5->_vptr_SharedPtrStateBase[1])();
        }
        (pTVar2->sourceImage).m_state = (SharedPtrStateBase *)0x0;
      }
      pSVar5 = (this->m_image).m_state;
    }
    (pTVar2->sourceImage).m_ptr = local_40->m_ptr;
    (pTVar2->sourceImage).m_state = pSVar5;
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pTVar2->sourceImage).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

CreateImageFromTexture::CreateImageFromTexture (SharedPtr<EGLImage>& image, SharedPtr<Texture> texture, bool useSync, bool serverSync)
	: Operation	("CreateImageFromTexture", useSync, serverSync)
{
	modifyGLObject(SharedPtr<Object>(texture));
	image = SharedPtr<EGLImage>(new EGLImage(getEvent(), getSync()));

	m_image					= image;
	m_texture				= texture;
	m_texture->sourceImage	= m_image;
}